

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

double google::protobuf::io::Tokenizer::ParseFloat(string *text)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  LogMessage *pLVar5;
  double result;
  char *end;
  char *start;
  string *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff58;
  LogLevel_conflict level;
  string local_90 [8];
  string *in_stack_ffffffffffffff78;
  char **in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  LogMessage local_58;
  double local_20;
  char *local_18;
  char *local_10;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_10 = (char *)std::__cxx11::string::c_str();
  local_20 = NoLocaleStrtod(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  if (((*local_18 == 'e') || (pcVar3 = local_18, *local_18 == 'E')) &&
     ((pcVar3 = local_18 + 1, *pcVar3 == '-' || (*pcVar3 == '+')))) {
    pcVar3 = local_18 + 2;
  }
  local_18 = pcVar3;
  if ((*local_18 == 'f') || (*local_18 == 'F')) {
    local_18 = local_18 + 1;
  }
  pLVar4 = (LogMessage *)(local_18 + -(long)local_10);
  pLVar5 = (LogMessage *)std::__cxx11::string::size();
  bVar2 = false;
  bVar1 = false;
  if ((pLVar4 != pLVar5) || (*local_10 == '-')) {
    pLVar5 = &local_58;
    internal::LogMessage::LogMessage
              (pLVar4,level,(char *)pLVar5,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    bVar2 = true;
    internal::LogMessage::operator<<(pLVar5,(char *)in_stack_ffffffffffffff48);
    CEscape(in_stack_ffffffffffffff78);
    bVar1 = true;
    pLVar4 = internal::LogMessage::operator<<(pLVar5,in_stack_ffffffffffffff48);
    internal::LogFinisher::operator=((LogFinisher *)pLVar5,pLVar4);
  }
  if (bVar1) {
    std::__cxx11::string::~string(local_90);
  }
  if (bVar2) {
    internal::LogMessage::~LogMessage((LogMessage *)0x562721);
  }
  return local_20;
}

Assistant:

double Tokenizer::ParseFloat(const std::string& text) {
  const char* start = text.c_str();
  char* end;
  double result = NoLocaleStrtod(start, &end);

  // "1e" is not a valid float, but if the tokenizer reads it, it will
  // report an error but still return it as a valid token.  We need to
  // accept anything the tokenizer could possibly return, error or not.
  if (*end == 'e' || *end == 'E') {
    ++end;
    if (*end == '-' || *end == '+') ++end;
  }

  // If the Tokenizer had allow_f_after_float_ enabled, the float may be
  // suffixed with the letter 'f'.
  if (*end == 'f' || *end == 'F') {
    ++end;
  }

  GOOGLE_LOG_IF(DFATAL, end - start != text.size() || *start == '-')
      << " Tokenizer::ParseFloat() passed text that could not have been"
         " tokenized as a float: "
      << CEscape(text);
  return result;
}